

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall
pugi::impl::anon_unknown_0::document_order_comparator::operator()
          (document_order_comparator *this,xpath_node *lhs,xpath_node *rhs)

{
  void *pvVar1;
  void *pvVar2;
  unspecified_bool_type p_Var3;
  xml_node_struct *ln_00;
  xml_node_struct *rn_00;
  bool bVar4;
  xml_node local_c8;
  xml_node local_c0;
  xml_attribute local_b8;
  xml_node_struct *local_b0;
  xml_node local_a8;
  xml_node local_a0;
  xml_attribute local_98;
  xml_node_struct *local_90;
  xml_node_struct *local_88;
  xml_attribute_struct *local_80;
  xml_attribute local_78;
  xml_attribute local_70;
  xml_attribute a;
  xml_node local_60;
  xml_attribute local_58;
  xml_attribute local_50;
  xml_node local_48;
  xml_node rn;
  xml_node ln;
  void *ro;
  void *lo;
  xpath_node *rhs_local;
  xpath_node *lhs_local;
  document_order_comparator *this_local;
  
  pvVar1 = document_buffer_order(lhs);
  pvVar2 = document_buffer_order(rhs);
  if ((pvVar1 == (void *)0x0) || (pvVar2 == (void *)0x0)) {
    rn = xpath_node::node(lhs);
    local_48 = xpath_node::node(rhs);
    local_50 = xpath_node::attribute(lhs);
    p_Var3 = xml_attribute::operator_cast_to_function_pointer(&local_50);
    bVar4 = false;
    if (p_Var3 != (unspecified_bool_type)0x0) {
      local_58 = xpath_node::attribute(rhs);
      p_Var3 = xml_attribute::operator_cast_to_function_pointer(&local_58);
      bVar4 = p_Var3 != (unspecified_bool_type)0x0;
    }
    if (bVar4) {
      local_60 = xpath_node::parent(lhs);
      a._attr = (xml_attribute_struct *)xpath_node::parent(rhs);
      bVar4 = xml_node::operator==(&local_60,(xml_node *)&a);
      if (bVar4) {
        local_70 = xpath_node::attribute(lhs);
        while( true ) {
          p_Var3 = xml_attribute::operator_cast_to_function_pointer(&local_70);
          if (p_Var3 == (unspecified_bool_type)0x0) {
            return false;
          }
          local_78 = xpath_node::attribute(rhs);
          bVar4 = xml_attribute::operator==(&local_70,&local_78);
          if (bVar4) break;
          local_80 = (xml_attribute_struct *)xml_attribute::next_attribute(&local_70);
          local_70 = (xml_attribute)local_80;
        }
        return true;
      }
      local_88 = (xml_node_struct *)xpath_node::parent(lhs);
      rn._root = local_88;
      local_90 = (xml_node_struct *)xpath_node::parent(rhs);
      local_48 = (xml_node)local_90;
    }
    else {
      local_98 = xpath_node::attribute(lhs);
      p_Var3 = xml_attribute::operator_cast_to_function_pointer(&local_98);
      if (p_Var3 == (unspecified_bool_type)0x0) {
        local_b8 = xpath_node::attribute(rhs);
        p_Var3 = xml_attribute::operator_cast_to_function_pointer(&local_b8);
        if (p_Var3 != (unspecified_bool_type)0x0) {
          local_c0 = xpath_node::parent(rhs);
          local_c8 = xpath_node::node(lhs);
          bVar4 = xml_node::operator==(&local_c0,&local_c8);
          if (bVar4) {
            return true;
          }
          local_48 = xpath_node::parent(rhs);
        }
      }
      else {
        local_a0 = xpath_node::parent(lhs);
        local_a8 = xpath_node::node(rhs);
        bVar4 = xml_node::operator==(&local_a0,&local_a8);
        if (bVar4) {
          return false;
        }
        local_b0 = (xml_node_struct *)xpath_node::parent(lhs);
        rn = (xml_node)local_b0;
      }
    }
    bVar4 = xml_node::operator==(&rn,&local_48);
    if (bVar4) {
      this_local._7_1_ = false;
    }
    else {
      bVar4 = xml_node::operator!(&rn);
      if ((bVar4) || (bVar4 = xml_node::operator!(&local_48), bVar4)) {
        this_local._7_1_ = xml_node::operator<(&rn,&local_48);
      }
      else {
        ln_00 = xml_node::internal_object(&rn);
        rn_00 = xml_node::internal_object(&local_48);
        this_local._7_1_ = node_is_before(ln_00,rn_00);
      }
    }
  }
  else {
    this_local._7_1_ = pvVar1 < pvVar2;
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(const xpath_node& lhs, const xpath_node& rhs) const
		{
			// optimized document order based check
			const void* lo = document_buffer_order(lhs);
			const void* ro = document_buffer_order(rhs);

			if (lo && ro) return lo < ro;

			// slow comparison
			xml_node ln = lhs.node(), rn = rhs.node();

			// compare attributes
			if (lhs.attribute() && rhs.attribute())
			{
				// shared parent
				if (lhs.parent() == rhs.parent())
				{
					// determine sibling order
					for (xml_attribute a = lhs.attribute(); a; a = a.next_attribute())
						if (a == rhs.attribute())
							return true;

					return false;
				}

				// compare attribute parents
				ln = lhs.parent();
				rn = rhs.parent();
			}
			else if (lhs.attribute())
			{
				// attributes go after the parent element
				if (lhs.parent() == rhs.node()) return false;

				ln = lhs.parent();
			}
			else if (rhs.attribute())
			{
				// attributes go after the parent element
				if (rhs.parent() == lhs.node()) return true;

				rn = rhs.parent();
			}

			if (ln == rn) return false;

			if (!ln || !rn) return ln < rn;

			return node_is_before(ln.internal_object(), rn.internal_object());
		}